

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O1

string * __thiscall
pbrt::RayDifferential::ToString_abi_cxx11_(string *__return_storage_ptr__,RayDifferential *this)

{
  char *local_20;
  
  local_20 = "false";
  if (this->hasDifferentials != false) {
    local_20 = "true";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Ray_const&,char_const*,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&>
            (__return_storage_ptr__,"[ ray: %s differentials: %s xo: %s xd: %s yo: %s yd: %s ]",
             &this->super_Ray,&local_20,&this->rxOrigin,&this->rxDirection,&this->ryOrigin,
             &this->ryDirection);
  return __return_storage_ptr__;
}

Assistant:

std::string RayDifferential::ToString() const {
    return StringPrintf("[ ray: %s differentials: %s xo: %s xd: %s yo: %s yd: %s ]",
                        ((const Ray &)(*this)), hasDifferentials ? "true" : "false",
                        rxOrigin, rxDirection, ryOrigin, ryDirection);
}